

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O0

void Abc_GraphSolve(Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Cnf_Dat_t *p;
  Vec_Int_t *p_00;
  sat_solver *s;
  int *piVar4;
  int *end;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uStack_60;
  int Status;
  word Mint2;
  word Mint1;
  word Total;
  int iCiVarBeg;
  int nVars;
  int iLit;
  int k;
  int i;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Cnf_Dat_t *pCnf;
  int nIters;
  Gia_Man_t *pGia_local;
  
  p = (Cnf_Dat_t *)Mf_ManGenerateCnf(pGia,8,0,1,0,0);
  p_00 = Vec_IntAlloc(100);
  uVar1 = Gia_ManCiNum(pGia);
  iVar3 = p->nVars;
  Mint2 = 0;
  uStack_60 = 0;
  s = sat_solver_new();
  sat_solver_setnvars(s,p->nVars);
  for (iLit = 0; iLit < p->nClauses; iLit = iLit + 1) {
    iVar2 = sat_solver_addclause(s,p->pClauses[iLit],p->pClauses[iLit + 1]);
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                    ,0x231,"void Abc_GraphSolve(Gia_Man_t *)");
    }
  }
  Vec_IntClear(p_00);
  for (nVars = 0; nVars < (int)uVar1; nVars = nVars + 1) {
    iVar2 = Abc_Var2Lit((iVar3 - uVar1) + nVars,1);
    Vec_IntPush(p_00,iVar2);
  }
  for (iLit = 0; iLit < 1000; iLit = iLit + 1) {
    piVar4 = Vec_IntArray(p_00);
    iVar3 = Vec_IntSize(p_00);
    iVar3 = sat_solver_solve_lexsat(s,piVar4,iVar3);
    if (iVar3 != 1) break;
    for (nVars = 0; iVar3 = Vec_IntSize(p_00), nVars < iVar3; nVars = nVars + 1) {
      iVar3 = Vec_IntEntry(p_00,nVars);
      iVar3 = Abc_LitNot(iVar3);
      Vec_IntWriteEntry(p_00,nVars,iVar3);
    }
    piVar4 = Vec_IntArray(p_00);
    end = Vec_IntLimit(p_00);
    iVar3 = sat_solver_addclause(s,piVar4,end);
    if (iVar3 == 0) break;
    for (nVars = 0; iVar3 = Vec_IntSize(p_00), nVars < iVar3; nVars = nVars + 1) {
      iVar3 = Vec_IntEntry(p_00,nVars);
      iVar3 = Abc_LitNot(iVar3);
      Vec_IntWriteEntry(p_00,nVars,iVar3);
    }
    uStack_60 = 0;
    for (nVars = 0; iVar3 = Vec_IntSize(p_00), nVars < iVar3; nVars = nVars + 1) {
      iVar3 = Vec_IntEntry(p_00,nVars);
      iVar3 = Abc_LitIsCompl(iVar3);
      if (iVar3 == 0) {
        uStack_60 = 1L << (((char)uVar1 + -1) - (char)nVars & 0x3fU) | uStack_60;
      }
    }
    if (Mint2 == 0) {
      Mint2 = uStack_60;
    }
  }
  dVar5 = Abc_Word2Double(uStack_60 - Mint2);
  dVar6 = Abc_Word2Double((uStack_60 - Mint2) / 1000);
  printf("Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ",dVar5,dVar6,(ulong)uVar1,1000);
  dVar5 = pow(2.0,(double)(int)uVar1);
  dVar6 = Abc_Word2Double(Mint2);
  dVar7 = Abc_Word2Double((uStack_60 - Mint2) / 1000);
  printf("Estimate = %.0f\n",(dVar5 - dVar6) / dVar7);
  sat_solver_delete(s);
  Cnf_DataFree(p);
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Abc_GraphSolve( Gia_Man_t * pGia )
{
    int nIters = 1000;
    Cnf_Dat_t * pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGia, 8, 0, 1, 0, 0 );
    sat_solver * pSat; Vec_Int_t * vLits = Vec_IntAlloc( 100 );
    int i, k, iLit, nVars = Gia_ManCiNum(pGia);
    int iCiVarBeg = pCnf->nVars - nVars;
    word Total = 0;
    word Mint1 = 0;
    word Mint2 = 0;

    // restart the SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // create trivial assignment
    Vec_IntClear( vLits );
    for ( k = 0; k < nVars; k++ )
        Vec_IntPush( vLits, Abc_Var2Lit(iCiVarBeg+k, 1) );
    // generate random assignment
    for ( i = 0; i < nIters; i++ )
    {
        int Status = sat_solver_solve_lexsat( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits) );
        if ( Status != l_True )
            break;
        assert( Status == l_True );
        // block this assignment
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        if ( !sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) ) )
            break;
        Vec_IntForEachEntry( vLits, iLit, k )
            Vec_IntWriteEntry( vLits, k, Abc_LitNot(iLit) );
        // collect new minterm
        Mint2 = 0;
        Vec_IntForEachEntry( vLits, iLit, k )
            if ( !Abc_LitIsCompl(iLit) )
                Mint2 |= ((word)1) << (nVars-1-k);
        if ( Mint1 == 0 )
            Mint1 = Mint2;
        // report
        //printf( "Iter %3d : ", i );
        //Extra_PrintBinary( stdout, (unsigned *)&Mint2, Abc_MinInt(64, nVars) ); printf( "\n" );
    }
    //Mint1 = 0;
    Total = (Mint2-Mint1)/nIters;
    printf( "Vars = %d   Iters = %d   Ave = %.0f   Total = %.0f  ", nVars, nIters, Abc_Word2Double(Mint2-Mint1), Abc_Word2Double(Total) );
    printf( "Estimate = %.0f\n", (pow(2,nVars)-Abc_Word2Double(Mint1))/Abc_Word2Double((Mint2-Mint1)/nIters) );

    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Vec_IntFree( vLits );
}